

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O2

IterateResult __thiscall gl4cts::StandardPageSizesTestCase::iterate(StandardPageSizesTestCase *this)

{
  ostringstream *this_00;
  ostringstream *this_01;
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  int *value;
  MessageBuilder *pMVar6;
  char *description;
  qpTestResult testResult;
  TestContext *this_02;
  GLint pageSizeZ;
  GLint pageSizeY;
  GLint pageSizeX;
  MessageBuilder *local_1c8;
  StandardPageSizesTestCase *local_1c0;
  Functions *local_1b8;
  undefined1 local_1b0 [384];
  
  bVar4 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_sparse_texture2");
  if (bVar4) {
    iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    local_1b8 = (Functions *)CONCAT44(extraout_var,iVar5);
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_01 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_01);
    std::operator<<((ostream *)this_01,"Testing getInternalformativ");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_01);
    local_1c8 = (MessageBuilder *)
                &(this->mStandardVirtualPageSizesTable)._M_t._M_impl.super__Rb_tree_header;
    local_1c0 = this;
    for (value = (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        value != (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish; value = value + 1) {
      pMVar6 = (MessageBuilder *)
               (this->mStandardVirtualPageSizesTable)._M_t._M_impl.super__Rb_tree_header._M_header.
               _M_left;
      while (pMVar6 != local_1c8) {
        iVar5 = *(int *)&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>.
                         field_0x18;
        iVar1 = *(int *)&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>.
                         field_0x1c;
        iVar2 = *(int *)&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>.
                         field_0x20;
        iVar3 = *(int *)&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>.
                         field_0x24;
        SparseTextureUtils::getTexturePageSizes
                  (local_1b8,*value,iVar5,&pageSizeX,&pageSizeY,&pageSizeZ);
        if (((pageSizeX != iVar1) || (pageSizeY != iVar2)) || (pageSizeZ != iVar3)) {
          local_1b0._0_8_ =
               ((local_1c0->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
          std::operator<<((ostream *)(local_1b0 + 8),"Standard Virtual Page Size mismatch, target: "
                         );
          local_1c8 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,value);
          this_00 = &local_1c8->m_str;
          std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,", format: ")
          ;
          std::ostream::operator<<(this_00,iVar5);
          std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,
                          ", returned: ");
          std::ostream::operator<<(this_00,pageSizeX);
          std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,"/");
          std::ostream::operator<<(this_00,pageSizeY);
          std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,"/");
          std::ostream::operator<<(this_00,pageSizeZ);
          std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,
                          ", expected: ");
          std::ostream::operator<<(this_00,iVar1);
          std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,"/");
          std::ostream::operator<<(this_00,iVar2);
          std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,"/");
          std::ostream::operator<<(this_00,iVar3);
          tcu::MessageBuilder::operator<<(local_1c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
          this_02 = (local_1c0->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
          description = "Fail";
          testResult = QP_TEST_RESULT_FAIL;
          goto LAB_00ad816a;
        }
        pMVar6 = (MessageBuilder *)std::_Rb_tree_increment((_Rb_tree_node_base *)pMVar6);
        this = local_1c0;
      }
    }
    this_02 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Pass";
    testResult = QP_TEST_RESULT_PASS;
  }
  else {
    this_02 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
LAB_00ad816a:
  tcu::TestContext::setTestResult(this_02,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult StandardPageSizesTestCase::iterate()
{
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_sparse_texture2"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");
		return STOP;
	}

	const Functions& gl = m_context.getRenderContext().getFunctions();

	m_testCtx.getLog() << tcu::TestLog::Message << "Testing getInternalformativ" << tcu::TestLog::EndMessage;

	for (std::vector<glw::GLint>::const_iterator iter = mSupportedTargets.begin(); iter != mSupportedTargets.end();
		 ++iter)
	{
		const GLint& target = *iter;

		for (std::map<glw::GLint, PageSizeStruct>::const_iterator formIter = mStandardVirtualPageSizesTable.begin();
			 formIter != mStandardVirtualPageSizesTable.end(); ++formIter)
		{
			const PageSizePair&   format = *formIter;
			const PageSizeStruct& page   = format.second;

			GLint pageSizeX;
			GLint pageSizeY;
			GLint pageSizeZ;
			SparseTextureUtils::getTexturePageSizes(gl, target, format.first, pageSizeX, pageSizeY, pageSizeZ);

			if (pageSizeX != page.xSize || pageSizeY != page.ySize || pageSizeZ != page.zSize)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Standard Virtual Page Size mismatch, target: " << target
								   << ", format: " << format.first << ", returned: " << pageSizeX << "/" << pageSizeY
								   << "/" << pageSizeZ << ", expected: " << page.xSize << "/" << page.ySize << "/"
								   << page.zSize << tcu::TestLog::EndMessage;

				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
				return STOP;
			}
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}